

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_name_abi_cxx11_(CompilerMSL *this,uint32_t id,bool allow_alias)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  long lVar4;
  ID local_2c;
  Meta *local_28;
  Meta *m;
  bool allow_alias_local;
  long lStack_18;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  lVar4 = CONCAT44(in_register_00000034,id);
  m._4_4_ = (uint32_t)CONCAT71(in_register_00000011,allow_alias);
  m._3_1_ = in_CL & 1;
  lStack_18 = lVar4;
  this_local = this;
  if (*(long *)(lVar4 + 0x7f8) != 0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)(*(long *)(lVar4 + 0x7f8) + 8));
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lVar4 + 0x6d0));
    if (uVar1 == uVar2) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,m._4_4_);
      local_28 = ParsedIR::find_meta((ParsedIR *)(lVar4 + 8),local_2c);
      if (((local_28 != (Meta *)0x0) &&
          (((local_28->decoration).qualified_alias_explicit_override & 1U) == 0)) &&
         (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
        ::std::__cxx11::string::string
                  ((string *)this,(string *)&(local_28->decoration).qualified_alias);
        return this;
      }
    }
  }
  Compiler::to_name_abi_cxx11_((Compiler *)this,id,SUB41(m._4_4_,0));
  return this;
}

Assistant:

string CompilerMSL::to_name(uint32_t id, bool allow_alias) const
{
	if (current_function && (current_function->self == ir.default_entry_point))
	{
		auto *m = ir.find_meta(id);
		if (m && !m->decoration.qualified_alias_explicit_override && !m->decoration.qualified_alias.empty())
			return m->decoration.qualified_alias;
	}
	return Compiler::to_name(id, allow_alias);
}